

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

bool __thiscall Assimp::Q3BSPFileParser::readData(Q3BSPFileParser *this,string *rMapName)

{
  ZipArchiveIOSystem *pZVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 extraout_var;
  size_type __new_size;
  reference pvVar6;
  size_type sVar7;
  size_t readSize;
  size_t size;
  IOStream *pMapFile;
  string *rMapName_local;
  Q3BSPFileParser *this_local;
  long *plVar5;
  
  pZVar1 = this->m_pZipArchive;
  uVar4 = std::__cxx11::string::c_str();
  uVar2 = (*(pZVar1->super_IOSystem)._vptr_IOSystem[2])(pZVar1,uVar4);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    pZVar1 = this->m_pZipArchive;
    uVar4 = std::__cxx11::string::c_str();
    iVar3 = (*(pZVar1->super_IOSystem)._vptr_IOSystem[4])(pZVar1,uVar4,"rb");
    plVar5 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar5 == (long *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      __new_size = (**(code **)(*plVar5 + 0x30))();
      std::vector<char,_std::allocator<char>_>::resize(&this->m_Data,__new_size);
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,0);
      sVar7 = (**(code **)(*plVar5 + 0x10))(plVar5,pvVar6,1,__new_size);
      if (sVar7 == __new_size) {
        (*(this->m_pZipArchive->super_IOSystem)._vptr_IOSystem[5])(this->m_pZipArchive,plVar5);
        this_local._7_1_ = true;
      }
      else {
        std::vector<char,_std::allocator<char>_>::clear(&this->m_Data);
        (*(this->m_pZipArchive->super_IOSystem)._vptr_IOSystem[5])(this->m_pZipArchive,plVar5);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Q3BSPFileParser::readData( const std::string &rMapName ) {
    if ( !m_pZipArchive->Exists( rMapName.c_str() ) )
        return false;

    IOStream *pMapFile = m_pZipArchive->Open( rMapName.c_str() );
    if ( nullptr == pMapFile )
        return false;

    const size_t size = pMapFile->FileSize();
    m_Data.resize( size );

    const size_t readSize = pMapFile->Read( &m_Data[0], sizeof( char ), size );
    if ( readSize != size ) {
        m_Data.clear();
        m_pZipArchive->Close(pMapFile);
        return false;
    }
    m_pZipArchive->Close( pMapFile );

    return true;
}